

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::SharedCtor
          (UniDirectionalLSTMLayerParams *this)

{
  UniDirectionalLSTMLayerParams *this_local;
  
  memset(&this->params_,0,0x21);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::SharedCtor() {
  ::memset(&params_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&params_) + sizeof(reverseinput_));
  _cached_size_ = 0;
}